

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void term_setup_window_titles(Terminal *term,char *title_hostname)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = conf_get_str(term->conf,0x69);
  safefree(term->window_title);
  safefree(term->icon_title);
  if (*pcVar1 == '\0') {
    if ((title_hostname == (char *)0x0) || (*title_hostname == '\0')) {
      pcVar1 = dupstr("FuZZterm");
    }
    else {
      pcVar1 = dupcat_fn(title_hostname," - ","FuZZterm",0);
    }
    term->window_title = pcVar1;
  }
  else {
    pcVar2 = dupstr(pcVar1);
    term->window_title = pcVar2;
  }
  pcVar1 = dupstr(pcVar1);
  term->icon_title = pcVar1;
  term->wintitle_codepage = L'\xffff';
  term->icontitle_codepage = L'\xffff';
  term->win_title_pending = true;
  term->win_icon_title_pending = true;
  return;
}

Assistant:

void term_setup_window_titles(Terminal *term, const char *title_hostname)
{
    const char *conf_title = conf_get_str(term->conf, CONF_wintitle);
    sfree(term->window_title);
    sfree(term->icon_title);
    if (*conf_title) {
        term->window_title = dupstr(conf_title);
        term->icon_title = dupstr(conf_title);
    } else {
        if (title_hostname && *title_hostname)
            term->window_title = dupcat(title_hostname, " - ", appname);
        else
            term->window_title = dupstr(appname);
        term->icon_title = dupstr(term->window_title);
    }
    term->wintitle_codepage = term->icontitle_codepage = DEFAULT_CODEPAGE;
    term->win_title_pending = true;
    term->win_icon_title_pending = true;
}